

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  uint uVar2;
  Arena *this_00;
  RepeatedField<int> *this_01;
  int iVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  LazyMessageExtension *pLVar6;
  int *piVar7;
  undefined7 in_register_00000009;
  char cVar8;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar9;
  LogMessage local_120;
  LogMessage local_e8;
  LogMessage local_b0;
  LogMessage local_78;
  int local_3c;
  LogFinisher local_35;
  undefined4 local_34;
  bool packed_local;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,packed);
  local_3c = value;
  pVar9 = Insert(this,number);
  pEVar4 = pVar9.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated == false) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x1f6);
      pLVar5 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_b0,pLVar5);
      LogMessage::~LogMessage(&local_78);
    }
    bVar1 = pEVar4->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar5 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_e8,pLVar5);
      LogMessage::~LogMessage(&local_b0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 8) {
      cVar8 = (char)local_34;
    }
    else {
      LogMessage::LogMessage
                (&local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x1f6);
      pLVar5 = LogMessage::operator<<
                         (&local_e8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      cVar8 = (char)local_34;
      LogFinisher::operator=((LogFinisher *)&local_120,pLVar5);
      LogMessage::~LogMessage(&local_e8);
    }
    if (pEVar4->is_packed != (bool)cVar8) {
      LogMessage::LogMessage
                (&local_120,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x1f7);
      pLVar5 = LogMessage::operator<<
                         (&local_120,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_35,pLVar5);
      LogMessage::~LogMessage(&local_120);
    }
  }
  else {
    pEVar4->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar5 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
      LogMessage::~LogMessage(&local_b0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 8) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x1f0);
      pLVar5 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_e8,pLVar5);
      LogMessage::~LogMessage(&local_78);
    }
    pEVar4->is_repeated = true;
    pEVar4->is_packed = SUB41(local_34,0);
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      pLVar6 = (LazyMessageExtension *)operator_new(0x10);
      pLVar6->_vptr_LazyMessageExtension = (_func_int **)0x0;
      pLVar6[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
    }
    else {
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      }
      pLVar6 = (LazyMessageExtension *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&this_00->impl_,0x10,
                          arena_destruct_object<google::protobuf::RepeatedField<int>>);
      pLVar6->_vptr_LazyMessageExtension = (_func_int **)0x0;
      pLVar6[1]._vptr_LazyMessageExtension = (_func_int **)this_00;
    }
    (pEVar4->field_0).lazymessage_value = pLVar6;
  }
  iVar3 = local_3c;
  this_01 = (pEVar4->field_0).repeated_int32_value;
  uVar2 = this_01->current_size_;
  if (uVar2 == this_01->total_size_) {
    RepeatedField<int>::Reserve(this_01,this_01->total_size_ + 1);
  }
  piVar7 = RepeatedField<int>::elements(this_01);
  piVar7[uVar2] = iVar3;
  this_01->current_size_ = uVar2 + 1;
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}